

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5ExprFunction(sqlite3_context *pCtx,int nArg,sqlite3_value **apVal,int bTcl)

{
  Fts5ExprNode *pExpr_00;
  sqlite3_value **ppsVar1;
  int iVar2;
  char **azArg;
  char *pcVar3;
  Fts5ExprNode *extraout_RDX;
  Fts5ExprNode *extraout_RDX_00;
  Fts5ExprNode *pExpr_01;
  uint uVar4;
  uint nArg_00;
  long lVar5;
  char *zErr;
  Fts5Config *pConfig;
  Fts5Expr *pExpr;
  char *local_70;
  Fts5Config *local_68;
  Fts5Expr *local_60;
  int local_54;
  Fts5Config *local_50;
  sqlite3_value **local_48;
  sqlite3 *local_40;
  Fts5Global *local_38;
  
  local_38 = (Fts5Global *)pCtx->pFunc->pUserData;
  local_40 = pCtx->pOut->db;
  local_70 = (char *)0x0;
  local_60 = (Fts5Expr *)0x0;
  local_68 = (Fts5Config *)0x0;
  if (nArg < 1) {
    pcVar3 = "fts5_expr_tcl";
    if (bTcl == 0) {
      pcVar3 = "fts5_expr";
    }
    local_70 = sqlite3_mprintf("wrong number of arguments to function %s",pcVar3);
    pCtx->isError = 1;
    sqlite3VdbeMemSetStr(pCtx->pOut,local_70,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
    sqlite3_free(local_70);
    return;
  }
  local_48 = apVal;
  if (nArg == 1 || bTcl == 0) {
    uVar4 = 1;
    local_50 = (Fts5Config *)0x1ea985;
  }
  else {
    local_50 = (Fts5Config *)sqlite3ValueText(apVal[1],'\x01');
    uVar4 = 2;
  }
  nArg_00 = (nArg - uVar4) + 3;
  iVar2 = sqlite3_initialize();
  if (iVar2 == 0) {
    azArg = (char **)sqlite3Malloc((ulong)nArg_00 << 3);
  }
  else {
    azArg = (char **)0x0;
  }
  ppsVar1 = local_48;
  if (azArg != (char **)0x0) {
    *azArg = (char *)0x0;
    azArg[1] = "main";
    azArg[2] = "tbl";
    local_54 = bTcl;
    if (nArg - uVar4 != 0 && (int)uVar4 <= nArg) {
      lVar5 = 0;
      do {
        pcVar3 = (char *)sqlite3ValueText(ppsVar1[(ulong)uVar4 + lVar5],'\x01');
        azArg[lVar5 + 3] = pcVar3;
        lVar5 = lVar5 + 1;
      } while ((ulong)((nArg - uVar4) + 3) - 3 != lVar5);
    }
    pcVar3 = (char *)sqlite3ValueText(*local_48,'\x01');
    iVar2 = sqlite3Fts5ConfigParse(local_38,local_40,nArg_00,azArg,&local_68,&local_70);
    pExpr_01 = extraout_RDX;
    if (iVar2 == 0) {
      iVar2 = sqlite3Fts5ExprNew(local_68,local_68->nCol,pcVar3,&local_60,&local_70);
      pExpr_01 = extraout_RDX_00;
    }
    if (iVar2 == 0) {
      pExpr_00 = local_60->pRoot;
      if (pExpr_00->xNext == (_func_int_Fts5Expr_ptr_Fts5ExprNode_ptr_int_i64 *)0x0) {
        pcVar3 = sqlite3_mprintf("");
      }
      else if (local_54 == 0) {
        pcVar3 = fts5ExprPrint(local_68,pExpr_00);
      }
      else {
        pcVar3 = fts5ExprPrintTcl(local_50,(char *)pExpr_00,pExpr_01);
      }
      if (pcVar3 == (char *)0x0) {
        iVar2 = 7;
      }
      else {
        setResultStrOrError(pCtx,pcVar3,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
        sqlite3_free(pcVar3);
        iVar2 = 0;
      }
    }
    if (iVar2 != 0) {
      if (local_70 == (char *)0x0) {
        sqlite3_result_error_code(pCtx,iVar2);
      }
      else {
        pCtx->isError = 1;
        sqlite3VdbeMemSetStr
                  (pCtx->pOut,local_70,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
        sqlite3_free(local_70);
      }
    }
    sqlite3_free(azArg);
    sqlite3Fts5ConfigFree(local_68);
    sqlite3Fts5ExprFree(local_60);
    return;
  }
  sqlite3_result_error_nomem(pCtx);
  return;
}

Assistant:

static void fts5ExprFunction(
  sqlite3_context *pCtx,          /* Function call context */
  int nArg,                       /* Number of args */
  sqlite3_value **apVal,          /* Function arguments */
  int bTcl
){
  Fts5Global *pGlobal = (Fts5Global*)sqlite3_user_data(pCtx);
  sqlite3 *db = sqlite3_context_db_handle(pCtx);
  const char *zExpr = 0;
  char *zErr = 0;
  Fts5Expr *pExpr = 0;
  int rc;
  int i;

  const char **azConfig;          /* Array of arguments for Fts5Config */
  const char *zNearsetCmd = "nearset";
  int nConfig;                    /* Size of azConfig[] */
  Fts5Config *pConfig = 0;
  int iArg = 1;

  if( nArg<1 ){
    zErr = sqlite3_mprintf("wrong number of arguments to function %s",
        bTcl ? "fts5_expr_tcl" : "fts5_expr"
    );
    sqlite3_result_error(pCtx, zErr, -1);
    sqlite3_free(zErr);
    return;
  }

  if( bTcl && nArg>1 ){
    zNearsetCmd = (const char*)sqlite3_value_text(apVal[1]);
    iArg = 2;
  }

  nConfig = 3 + (nArg-iArg);
  azConfig = (const char**)sqlite3_malloc64(sizeof(char*) * nConfig);
  if( azConfig==0 ){
    sqlite3_result_error_nomem(pCtx);
    return;
  }
  azConfig[0] = 0;
  azConfig[1] = "main";
  azConfig[2] = "tbl";
  for(i=3; iArg<nArg; iArg++){
    azConfig[i++] = (const char*)sqlite3_value_text(apVal[iArg]);
  }

  zExpr = (const char*)sqlite3_value_text(apVal[0]);

  rc = sqlite3Fts5ConfigParse(pGlobal, db, nConfig, azConfig, &pConfig, &zErr);
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5ExprNew(pConfig, pConfig->nCol, zExpr, &pExpr, &zErr);
  }
  if( rc==SQLITE_OK ){
    char *zText;
    if( pExpr->pRoot->xNext==0 ){
      zText = sqlite3_mprintf("");
    }else if( bTcl ){
      zText = fts5ExprPrintTcl(pConfig, zNearsetCmd, pExpr->pRoot);
    }else{
      zText = fts5ExprPrint(pConfig, pExpr->pRoot);
    }
    if( zText==0 ){
      rc = SQLITE_NOMEM;
    }else{
      sqlite3_result_text(pCtx, zText, -1, SQLITE_TRANSIENT);
      sqlite3_free(zText);
    }
  }

  if( rc!=SQLITE_OK ){
    if( zErr ){
      sqlite3_result_error(pCtx, zErr, -1);
      sqlite3_free(zErr);
    }else{
      sqlite3_result_error_code(pCtx, rc);
    }
  }
  sqlite3_free((void *)azConfig);
  sqlite3Fts5ConfigFree(pConfig);
  sqlite3Fts5ExprFree(pExpr);
}